

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSceneManager.cpp
# Opt level: O0

IBillboardSceneNode * __thiscall
irr::scene::CSceneManager::addBillboardSceneNode
          (CSceneManager *this,ISceneNode *parent,dimension2d<float> *size,vector3df *position,
          s32 id,SColor colorTop,SColor colorBottom)

{
  vector3df *position_00;
  ISceneManager *in_RDI;
  SColor in_R8D;
  undefined4 in_R9D;
  undefined4 in_stack_00000008;
  IBillboardSceneNode *node;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa4;
  undefined8 in_stack_ffffffffffffffb0;
  s32 id_00;
  IBillboardSceneNode *pIVar1;
  CBillboardSceneNode *in_stack_ffffffffffffffc8;
  SColor in_stack_ffffffffffffffd0;
  
  id_00 = (s32)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  position_00 = (vector3df *)operator_new(0x130);
  CBillboardSceneNode::CBillboardSceneNode
            (in_stack_ffffffffffffffc8,(ISceneNode *)CONCAT44(in_R9D,in_stack_00000008),in_RDI,id_00
             ,position_00,
             (dimension2d<float> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_00000008),in_R8D,
             in_stack_ffffffffffffffd0);
  pIVar1 = (IBillboardSceneNode *)0x0;
  if (position_00 != (vector3df *)0x0) {
    pIVar1 = (IBillboardSceneNode *)
             ((long)&position_00->X + *(long *)(*(long *)position_00 + -0x18));
  }
  IReferenceCounted::drop((IReferenceCounted *)CONCAT44(in_stack_ffffffffffffff9c,in_R9D));
  return pIVar1;
}

Assistant:

IBillboardSceneNode *CSceneManager::addBillboardSceneNode(ISceneNode *parent,
		const core::dimension2d<f32> &size, const core::vector3df &position, s32 id,
		video::SColor colorTop, video::SColor colorBottom)
{
	if (!parent)
		parent = this;

	IBillboardSceneNode *node = new CBillboardSceneNode(parent, this, id, position, size,
			colorTop, colorBottom);
	node->drop();

	return node;
}